

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O2

GCfunc * lj_lib_pushcc(lua_State *L,lua_CFunction f,int id,int n)

{
  GCfunc *pGVar1;
  
  lua_pushcclosure(L,f,n);
  pGVar1 = (GCfunc *)(ulong)L->top[-1].u32.lo;
  (pGVar1->c).ffid = (uint8_t)id;
  (pGVar1->c).pc.ptr32 = (L->glref).ptr32 + 0x180;
  return pGVar1;
}

Assistant:

GCfunc *lj_lib_pushcc(lua_State *L, lua_CFunction f, int id, int n)
{
  GCfunc *fn;
  lua_pushcclosure(L, f, n);
  fn = funcV(L->top-1);
  fn->c.ffid = (uint8_t)id;
  setmref(fn->c.pc, &G(L)->bc_cfunc_int);
  return fn;
}